

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictVectorizer.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::DictVectorizer::clear_Map(DictVectorizer *this)

{
  MapCase MVar1;
  DictVectorizer *this_local;
  
  MVar1 = Map_case(this);
  if (MVar1 != MAP_NOT_SET) {
    if (MVar1 == kStringToIndex) {
      if ((this->Map_).stringtoindex_ != (StringVector *)0x0) {
        (*(((this->Map_).stringtoindex_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if ((MVar1 == kInt64ToIndex) && ((this->Map_).stringtoindex_ != (StringVector *)0x0)) {
      (*(((this->Map_).stringtoindex_)->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void DictVectorizer::clear_Map() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.DictVectorizer)
  switch (Map_case()) {
    case kStringToIndex: {
      delete Map_.stringtoindex_;
      break;
    }
    case kInt64ToIndex: {
      delete Map_.int64toindex_;
      break;
    }
    case MAP_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = MAP_NOT_SET;
}